

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  pointer piVar4;
  bool bVar5;
  Option *pOVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  NetPrivate *pNVar10;
  void *in_R8;
  size_t i_2;
  ulong uVar11;
  size_t i;
  Mat *pMVar12;
  Mat bottom_blob;
  Mat top_blob;
  allocator_type local_e1;
  Option *local_e0;
  Mat local_d8;
  pointer local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined8 uStack_74;
  Allocator *local_68;
  int iStack_60;
  int iStack_5c;
  int iStack_58;
  undefined8 uStack_54;
  pointer local_48;
  pointer local_38;
  
  if (layer->one_blob_only != true) {
    local_e0 = opt;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&stack0xffffffffffffff78,
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_d8);
    lVar9 = 0;
    uVar11 = 0;
    local_38 = (pointer)blob_mats;
    while( true ) {
      pOVar6 = local_e0;
      piVar4 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
      if (uVar8 <= uVar11) break;
      pMVar12 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&((pointer)blob_mats)->name
                 )->_M_impl).super__Vector_impl_data._M_start + piVar4[uVar11];
      pNVar10 = (NetPrivate *)((long)&local_88->data + lVar9);
      Mat::release((Mat *)pNVar10);
      if (((local_e0->lightmode == true) && (layer->support_inplace == true)) &&
         (*pMVar12->refcount != 1)) {
        Mat::clone(&local_d8,(__fn *)pMVar12,local_e0->blob_allocator,(int)uVar8,in_R8);
        Mat::operator=((Mat *)((long)&local_88->data + lVar9),&local_d8);
        pNVar10 = (NetPrivate *)&local_d8;
        Mat::~Mat(&local_d8);
        blob_mats = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_38;
      }
      if (*(int *)((long)&local_88->dims + lVar9) == 0) {
        pNVar10 = (NetPrivate *)((long)&local_88->data + lVar9);
        Mat::operator=((Mat *)pNVar10,pMVar12);
      }
      convert_layout(pNVar10,(Mat *)((long)&local_88->data + lVar9),layer,local_e0);
      uVar11 = uVar11 + 1;
      lVar9 = lVar9 + 0x48;
    }
    if ((local_e0->lightmode == false) || (layer->support_inplace != true)) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8,
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,&local_e1);
      iVar7 = (*layer->_vptr_Layer[6])(layer,&stack0xffffffffffffff78,&local_d8,pOVar6);
      if (iVar7 != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
        goto LAB_00142d8a;
      }
      lVar9 = 0;
      for (uVar11 = 0;
          piVar4 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar11 < (ulong)((long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_finish - (long)piVar4 >> 2);
          uVar11 = uVar11 + 1) {
        Mat::operator=((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                        &((pointer)blob_mats)->name)->_M_impl).super__Vector_impl_data._M_start +
                       piVar4[uVar11],(Mat *)((bool *)local_d8.data + lVar9));
        lVar9 = lVar9 + 0x48;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
LAB_00142e34:
      iVar7 = 0;
      for (uVar11 = 0;
          piVar4 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar11 < (ulong)((long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2);
          uVar11 = uVar11 + 1) {
        if (pOVar6->lightmode == true) {
          Mat::release((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                        &((pointer)blob_mats)->name)->_M_impl).super__Vector_impl_data._M_start +
                       piVar4[uVar11]);
        }
      }
      bVar5 = true;
    }
    else {
      iVar7 = (*layer->_vptr_Layer[8])(layer,&stack0xffffffffffffff78,local_e0);
      if (iVar7 == 0) {
        lVar9 = 0;
        for (uVar11 = 0;
            piVar4 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar11 < (ulong)((long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2);
            uVar11 = uVar11 + 1) {
          Mat::operator=((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                          &((pointer)blob_mats)->name)->_M_impl).super__Vector_impl_data._M_start +
                         piVar4[uVar11],(Mat *)((long)&local_88->data + lVar9));
          lVar9 = lVar9 + 0x48;
        }
        goto LAB_00142e34;
      }
LAB_00142d8a:
      bVar5 = false;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&stack0xffffffffffffff78);
    goto joined_r0x00142e76;
  }
  piVar3 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = *(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = *piVar3;
  local_d8.cstep = 0;
  pMVar12 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + iVar1;
  local_d8.data = (Option *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8._20_8_ = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8._52_8_ = 0;
  if (((opt->lightmode == true) && (layer->support_inplace == true)) && (*pMVar12->refcount != 1)) {
    Mat::clone((Mat *)&stack0xffffffffffffff78,(__fn *)pMVar12,opt->blob_allocator,(int)piVar3,in_R8
              );
    Mat::operator=(&local_d8,(Mat *)&stack0xffffffffffffff78);
    pNVar10 = (NetPrivate *)&stack0xffffffffffffff78;
    Mat::~Mat((Mat *)pNVar10);
    if (local_d8.dims == 0) goto LAB_00142b32;
  }
  else {
LAB_00142b32:
    pNVar10 = (NetPrivate *)&local_d8;
    Mat::operator=((Mat *)pNVar10,pMVar12);
  }
  convert_layout(pNVar10,&local_d8,layer,opt);
  if ((opt->lightmode == true) && (layer->support_inplace == true)) {
    iVar7 = (*layer->_vptr_Layer[9])(layer,&local_d8,opt);
    if (iVar7 == 0) {
      Mat::operator=((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start + iVar2,&local_d8);
      goto LAB_00142dac;
    }
LAB_00142d3b:
    bVar5 = false;
  }
  else {
    local_48 = (pointer)0x0;
    local_88 = (pointer)0x0;
    uStack_80 = 0;
    uStack_7c = 0;
    uStack_78 = 0;
    uStack_74 = 0;
    local_68 = (Allocator *)0x0;
    iStack_60 = 0;
    iStack_5c = 0;
    iStack_58 = 0;
    uStack_54 = 0;
    iVar7 = (*layer->_vptr_Layer[7])(layer,&local_d8,&stack0xffffffffffffff78,opt);
    if (iVar7 != 0) {
      Mat::~Mat((Mat *)&stack0xffffffffffffff78);
      goto LAB_00142d3b;
    }
    Mat::operator=((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start + iVar2,(Mat *)&stack0xffffffffffffff78);
    Mat::~Mat((Mat *)&stack0xffffffffffffff78);
LAB_00142dac:
    iVar7 = 0;
    bVar5 = true;
    if (opt->lightmode == true) {
      Mat::release((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start + iVar1);
    }
  }
  Mat::~Mat(&local_d8);
joined_r0x00142e76:
  if (bVar5) {
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        convert_layout(bottom_blob, layer, opt);

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            convert_layout(bottom_blobs[i], layer, opt);
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}